

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record-full.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  mapped_type *pmVar4;
  long *plVar5;
  bool doRecord;
  AudioLogger audioLogger;
  size_t totalSize_bytes;
  Callback cbAudio;
  duration<long,_std::ratio<1L,_1000L>_> local_2a0;
  Parameters parameters;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  argm;
  ofstream fout;
  int aiStack_200 [120];
  
  printf("Usage: %s output.kbd [-cN]\n",*argv);
  puts("    -cN - select capture device N");
  puts("    -CN - number N of capture channels N");
  putchar(10);
  if (argc < 2) {
    iVar2 = -0x7f;
  }
  else {
    parseCmdArguments_abi_cxx11_(&argm,argc,argv);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fout,"c",(allocator<char> *)&cbAudio);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&argm,(key_type *)&fout);
    iVar2 = 0;
    if (pmVar4->_M_string_length != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&parameters,"c",(allocator<char> *)&totalSize_bytes);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&argm,(key_type *)&parameters);
      iVar2 = std::__cxx11::stoi(pmVar4,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&parameters);
    }
    std::__cxx11::string::~string((string *)&fout);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fout,"C",(allocator<char> *)&cbAudio);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&argm,(key_type *)&fout);
    iVar3 = 0;
    if (pmVar4->_M_string_length != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&parameters,"C",(allocator<char> *)&totalSize_bytes);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&argm,(key_type *)&parameters);
      iVar3 = std::__cxx11::stoi(pmVar4,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&parameters);
    }
    std::__cxx11::string::~string((string *)&fout);
    doRecord = true;
    totalSize_bytes = 0;
    std::ofstream::ofstream(&fout,argv[1],_S_bin);
    if (*(int *)((long)aiStack_200 + *(long *)(_fout + -0x18)) == 0) {
      AudioLogger::AudioLogger(&audioLogger);
      cbAudio.super__Function_base._M_manager = (_Manager_type)0x0;
      cbAudio._M_invoker = (_Invoker_type)0x0;
      cbAudio.super__Function_base._M_functor = (_Any_data)0x0;
      plVar5 = (long *)operator_new(0x18);
      *plVar5 = (long)&doRecord;
      plVar5[1] = (long)&totalSize_bytes;
      plVar5[2] = (long)&fout;
      cbAudio.super__Function_base._M_functor._M_unused._M_object = plVar5;
      cbAudio._M_invoker =
           std::
           _Function_handler<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/record-full.cpp:40:37)>
           ::_M_invoke;
      cbAudio.super__Function_base._M_manager =
           std::
           _Function_handler<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/record-full.cpp:40:37)>
           ::_M_manager;
      parameters.callback.super__Function_base._M_manager = (_Manager_type)0x0;
      parameters.callback._M_invoker = (_Invoker_type)0x0;
      parameters.callback.super__Function_base._M_functor = (_Any_data)0x0;
      parameters.captureId = -1;
      parameters.nChannels = -1;
      parameters.sampleRate = -1;
      parameters.sampleType = F32SYS;
      parameters.filter = FirstOrderHighPass;
      parameters.freqCutoff_Hz = 1000.0;
      std::
      function<void_(const_std::vector<std::array<float,_512UL>,_std::allocator<std::array<float,_512UL>_>_>_&)>
      ::operator=(&parameters.callback,&cbAudio);
      parameters.sampleRate = 16000;
      parameters.filter = None;
      parameters.freqCutoff_Hz = 100.0;
      parameters.captureId = iVar2;
      parameters.nChannels = iVar3;
      bVar1 = AudioLogger::install(&audioLogger,&parameters);
      if (bVar1) {
        do {
          while (doRecord == true) {
            doRecord = false;
            AudioLogger::record(&audioLogger,0.5,0);
          }
          local_2a0.__r = 1;
          std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_2a0);
        } while( true );
      }
      fwrite("Failed to install audio logger\n",0x1f,1,_stderr);
      std::_Function_base::~_Function_base((_Function_base *)&parameters);
      std::_Function_base::~_Function_base(&cbAudio.super__Function_base);
      AudioLogger::~AudioLogger(&audioLogger);
    }
    else {
      fprintf(_stderr,"Failed to open file \'%s\'\n",argv[1]);
    }
    std::ofstream::~ofstream(&fout);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&argm._M_t);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int main(int argc, char ** argv) {
    printf("Usage: %s output.kbd [-cN]\n", argv[0]);
    printf("    -cN - select capture device N\n");
    printf("    -CN - number N of capture channels N\n");
    printf("\n");

    if (argc < 2) {
        return -127;
    }

    auto argm = parseCmdArguments(argc, argv);
    int captureId = argm["c"].empty() ? 0 : std::stoi(argm["c"]);
    int nChannels = argm["C"].empty() ? 0 : std::stoi(argm["C"]);

    bool doRecord = true;
    size_t totalSize_bytes = 0;

    std::ofstream fout(argv[1], std::ios::binary);
    if (fout.good() == false) {
        fprintf(stderr, "Failed to open file '%s'\n", argv[1]);
        return -1;
    }

    AudioLogger audioLogger;
    AudioLogger::Callback cbAudio = [&](const auto & frames) {
        doRecord = true;

        for (const auto & frame : frames) {
            totalSize_bytes += sizeof(frame[0])*frame.size();
            fout.write((char *)(frame.data()), sizeof(frame[0])*frame.size());
            fout.flush();
        }

        printf("Total data saved: %g MB\n", ((float)(totalSize_bytes)/1024.0f/1024.0f));
    };

    AudioLogger::Parameters parameters;
    parameters.callback = std::move(cbAudio);
    parameters.captureId = captureId;
    parameters.nChannels = nChannels;
    parameters.sampleRate = kSampleRate;
    parameters.filter = EAudioFilter::None;
    parameters.freqCutoff_Hz = kFreqCutoff_Hz;

    if (audioLogger.install(std::move(parameters)) == false) {
        fprintf(stderr, "Failed to install audio logger\n");
        return -1;
    }

    while (true) {
        if (doRecord) {
            doRecord = false;
            audioLogger.record(0.5f, 0);
        } else {
            std::this_thread::sleep_for(std::chrono::milliseconds(1));
        }
    }

    return 0;
}